

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_set_dwa_compression_level(exr_context_t ctxt,int part_index,float level)

{
  int in_ESI;
  char *in_RDI;
  float in_XMM0_Da;
  exr_priv_part_t part;
  exr_result_t rv;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t_conflict)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t_conflict)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if ((*in_RDI == '\x01') || (*in_RDI == '\x04')) {
      if ((in_XMM0_Da < 0.0) || (6.5504e+09 < in_XMM0_Da)) {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid dwa quality level specified");
      }
      else {
        *(float *)(*(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8) + 0xbc) = in_XMM0_Da;
        local_4 = 0;
        internal_exr_unlock((exr_const_context_t_conflict)(ulong)in_stack_ffffffffffffffe0);
      }
    }
    else {
      internal_exr_unlock((exr_const_context_t_conflict)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_dwa_compression_level (exr_context_t ctxt, int part_index, float level)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    // avoid bad math (fp exceptions or whatever) by clamping here
    // there has always been a clamp to 0, but on the upper end, there
    // is a limit too, where you only get black images anyway, so that
    // is not particularly useful, not that any large value will
    // really be crushing the image
    if (level >= 0.f && level <= (65504.f*100000.f))
    {
        part->dwa_compression_level = level;
        rv                          = EXR_ERR_SUCCESS;
    }
    else
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid dwa quality level specified"));
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}